

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O1

string * getCommand_abi_cxx11_(int socket_fd,pollfd *pollData,bool *msgFlags,int id)

{
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  undefined8 extraout_RAX;
  long lVar4;
  string *this;
  ulong uVar5;
  char local_198 [8];
  char command [256];
  size_type *local_88;
  string cmdString;
  undefined1 *local_58 [2];
  undefined1 local_48 [20];
  int local_34;
  
  local_88 = &cmdString._M_string_length;
  cmdString._M_dataplus._M_p = (pointer)0x0;
  cmdString._M_string_length._0_1_ = 0;
  command._248_8_ = msgFlags;
  local_34 = socket_fd;
  cmdString.field_2._8_8_ = operator_new__(0x48);
  *(undefined8 *)cmdString.field_2._8_8_ = 2;
  lVar4 = 0;
  do {
    *(long *)(cmdString.field_2._8_8_ + lVar4 + 8) = cmdString.field_2._8_8_ + lVar4 + 0x18;
    *(undefined8 *)(cmdString.field_2._8_8_ + lVar4 + 0x10) = 0;
    *(undefined1 *)(cmdString.field_2._8_8_ + lVar4 + 0x18) = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x40);
  this = (string *)(cmdString.field_2._8_8_ + 8);
  if (cmdString._M_dataplus._M_p == (pointer)0x0) {
    uVar5 = 0;
    do {
      iVar1 = poll((pollfd *)pollData,1,500);
      if (iVar1 == 0) {
        if (*(char *)(command._248_8_ + (long)id) == '\x01') {
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"msg","");
          std::__cxx11::string::operator=((string *)this,(string *)local_58);
          if (local_58[0] == local_48) goto LAB_00105a3a;
          goto LAB_00105a35;
        }
      }
      else if (iVar1 == -1) {
        perror("Error wiht polling");
      }
      else {
        bzero(local_198,0x100);
        sVar2 = recv(local_34,local_198,0xff,0);
        if ((int)sVar2 == -1) {
          getCommand_abi_cxx11_();
          if (local_88 != &cmdString._M_string_length) {
            operator_delete(local_88);
          }
          _Unwind_Resume(extraout_RAX);
        }
        local_198[(int)sVar2] = '\0';
        local_58[0] = local_48;
        sVar3 = strlen(local_198);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,local_198,local_198 + sVar3);
        std::__cxx11::string::operator=((string *)&local_88,(string *)local_58);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0]);
        }
        uVar5 = uVar5 + 1;
        if (0xf < uVar5) {
          this = (string *)0x0;
          goto LAB_00105a3a;
        }
      }
    } while (cmdString._M_dataplus._M_p == (pointer)0x0);
  }
  std::__cxx11::string::find((char *)&local_88,0x1091e5,0);
  std::__cxx11::string::substr((ulong)local_58,(ulong)&local_88);
  std::__cxx11::string::operator=((string *)this,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)&local_88);
  std::__cxx11::string::operator=((string *)(cmdString.field_2._8_8_ + 0x28),(string *)local_58);
  if (local_58[0] != local_48) {
LAB_00105a35:
    operator_delete(local_58[0]);
  }
LAB_00105a3a:
  if (local_88 != &cmdString._M_string_length) {
    operator_delete(local_88);
  }
  return this;
}

Assistant:

string* getCommand(int socket_fd, struct pollfd* pollData, bool* msgFlags, int id){

    char command[MAXDATASIZE];
    string cmdString;
    int numbytes = 0,rv = -1;
    string* returns = new string[2];


    //keep count of number of empty data recieved,
    // if more than max number was recieved, we know that the client has
    //  been disconnected
    size_t count = 0;

    while(cmdString.length() == 0){

        //check if there was something received on the socket,
        // if nothing received within .5 seconds then check if a message is
        // in the message queue
        rv = poll(pollData, 1, 500);


        if(rv == -1){
            perror("Error wiht polling");
        }
        // check if there was a time out, then check the message queue
        else if(rv == 0){
            if(msgFlags[id]){
                //propogate up that a message from another users has been receieved
                returns[0] = string("msg");
                return returns;
            }
        }
        // something was received on the socket connection
        else{
            //zero out the command just in case
            bzero(command,MAXDATASIZE);

            //get the message
            if ((numbytes = recv(socket_fd, command, MAXDATASIZE - 1, 0)) == -1) {
                perror("recv");
                exit(1);
            }

            //add null terminator to the received string
            command[numbytes] = '\0';

            //convert to c++ string
            cmdString = string(command);

            //check for the client disconnect
            count++;
            if(count > RECIEVE_MAX)
                return NULL;
        }
    }

    //finish parsing input and return
    size_t spacePos = cmdString.find(" ");
    returns[0] = cmdString.substr(0,spacePos);
    returns[1] = cmdString.substr(spacePos + 1);


    return returns;

}